

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O2

uint64_t __thiscall double_conversion::Double::DiyFpToUint64(Double *this,DiyFp diy_fp)

{
  int exponent;
  int iVar1;
  uint uVar2;
  uint64_t significand;
  ulong uVar3;
  
  uVar3 = diy_fp.f_;
  for (; iVar1 = (int)uVar3, (ulong)this >> 0x35 != 0; this = (Double *)((ulong)this >> 1)) {
    uVar3 = (ulong)(iVar1 + 1);
  }
  if (0x3cb < iVar1) {
    return 0x7ff0000000000000;
  }
  if (iVar1 < -0x432) {
    return 0;
  }
  uVar2 = iVar1 + 0x433;
  while( true ) {
    uVar3 = (ulong)this & 0x10000000000000;
    if (((int)(uVar2 - 0x433) < -0x431) || (uVar3 != 0)) break;
    this = (Double *)((long)this * 2);
    uVar2 = uVar2 - 1;
  }
  if (uVar3 != 0) {
    uVar3 = (ulong)uVar2 << 0x34;
  }
  if (uVar2 != 1) {
    uVar3 = (ulong)uVar2 << 0x34;
  }
  return (ulong)this & 0xfffffffffffff | uVar3;
}

Assistant:

static uint64_t DiyFpToUint64(DiyFp diy_fp) {
    uint64_t significand = diy_fp.f();
    int exponent = diy_fp.e();
    while (significand > kHiddenBit + kSignificandMask) {
      significand >>= 1;
      exponent++;
    }
    if (exponent >= kMaxExponent) {
      return kInfinity;
    }
    if (exponent < kDenormalExponent) {
      return 0;
    }
    while (exponent > kDenormalExponent && (significand & kHiddenBit) == 0) {
      significand <<= 1;
      exponent--;
    }
    uint64_t biased_exponent;
    if (exponent == kDenormalExponent && (significand & kHiddenBit) == 0) {
      biased_exponent = 0;
    } else {
      biased_exponent = static_cast<uint64_t>(exponent + kExponentBias);
    }
    return (significand & kSignificandMask) |
        (biased_exponent << kPhysicalSignificandSize);
  }